

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O0

void __thiscall mocker::Annotator::checkVarDecl(Annotator *this,VarDeclStmt *node)

{
  SemanticContext *pSVar1;
  unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
  *puVar2;
  PosPair pos;
  PosPair PVar3;
  bool bVar4;
  element_type *peVar5;
  CompileError *this_00;
  ASTNode *this_01;
  mapped_type *rhs;
  IncompatibleTypes *this_02;
  mapped_type *pmVar6;
  shared_ptr<mocker::ast::Type> *lhs;
  NodeID local_a0;
  size_t local_98;
  size_t sStack_90;
  size_t local_88;
  size_t sStack_80;
  NodeID local_78;
  shared_ptr<mocker::ast::ASTNode> local_70;
  shared_ptr<mocker::ast::ASTNode> local_60 [2];
  NodeID local_40;
  size_t local_38;
  size_t sStack_30;
  size_t local_28;
  size_t sStack_20;
  VarDeclStmt *local_18;
  VarDeclStmt *node_local;
  Annotator *this_local;
  
  local_18 = node;
  node_local = (VarDeclStmt *)this;
  peVar5 = std::
           __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&node->identifier);
  bVar4 = std::operator==(&peVar5->val,"this");
  if (bVar4) {
    this_00 = (CompileError *)__cxa_allocate_exception(0x48);
    puVar2 = this->pos;
    local_40 = ast::ASTNode::getID((ASTNode *)local_18);
    pmVar6 = std::
             unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
             ::at(puVar2,&local_40);
    local_38 = (pmVar6->first).line;
    sStack_30 = (pmVar6->first).col;
    local_28 = (pmVar6->second).line;
    sStack_20 = (pmVar6->second).col;
    pos.first = pmVar6->first;
    pos.second = pmVar6->second;
    CompileError::CompileError(this_00,pos);
    __cxa_throw(this_00,&CompileError::typeinfo,CompileError::~CompileError);
  }
  std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Type,void>
            (local_60,&local_18->type);
  visit(this,local_60);
  std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(local_60);
  bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_18->initExpr);
  if (bVar4) {
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
              (&local_70,&local_18->initExpr);
    visit(this,&local_70);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_70);
    lhs = &local_18->type;
    pSVar1 = this->ctx;
    this_01 = &std::
               __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_18->initExpr)->super_ASTNode;
    local_78 = ast::ASTNode::getID(this_01);
    rhs = std::
          unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Type>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>_>
          ::operator[](&pSVar1->exprType,&local_78);
    bVar4 = assignable(this,lhs,rhs);
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      this_02 = (IncompatibleTypes *)__cxa_allocate_exception(0x48);
      puVar2 = this->pos;
      local_a0 = ast::ASTNode::getID((ASTNode *)local_18);
      pmVar6 = std::
               unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
               ::at(puVar2,&local_a0);
      local_98 = (pmVar6->first).line;
      sStack_90 = (pmVar6->first).col;
      local_88 = (pmVar6->second).line;
      sStack_80 = (pmVar6->second).col;
      PVar3.first = pmVar6->first;
      PVar3.second = pmVar6->second;
      IncompatibleTypes::CompileError(this_02,PVar3);
      __cxa_throw(this_02,&IncompatibleTypes::typeinfo,IncompatibleTypes::~IncompatibleTypes);
    }
  }
  return;
}

Assistant:

void checkVarDecl(const ast::VarDeclStmt &node) const {
    if (node.identifier->val == "this")
      throw CompileError(pos.at(node.getID()));
    visit(node.type);
    if (!node.initExpr)
      return;
    visit(node.initExpr);
    if (!assignable(node.type, ctx.exprType[node.initExpr->getID()]))
      throw IncompatibleTypes(pos.at(node.getID()));
  }